

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_Identifier.h
# Opt level: O3

string * __thiscall
soul::IdentifierPath::toString_abi_cxx11_(string *__return_storage_ptr__,IdentifierPath *this)

{
  ulong uVar1;
  long lVar2;
  allocator<char> local_49;
  long *local_48 [2];
  long local_38 [2];
  
  local_48[0] = local_38;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_48,"::","");
  if ((this->pathSections).numActive == 0) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    __return_storage_ptr__->_M_string_length = 0;
    (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  }
  else {
    std::__cxx11::string::string<soul::Identifier,void>
              ((string *)__return_storage_ptr__,(this->pathSections).items,&local_49);
    if (1 < (this->pathSections).numActive) {
      uVar1 = 1;
      lVar2 = 8;
      do {
        std::__cxx11::string::_M_append((char *)__return_storage_ptr__,(ulong)local_48[0]);
        if ((this->pathSections).numActive <= uVar1) {
          throwInternalCompilerError("index < numActive","operator[]",0x9f);
        }
        std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>::
        append<soul::Identifier>
                  (__return_storage_ptr__,
                   (Identifier *)((long)&((this->pathSections).items)->name + lVar2));
        uVar1 = uVar1 + 1;
        lVar2 = lVar2 + 8;
      } while (uVar1 < (this->pathSections).numActive);
    }
  }
  if (local_48[0] != local_38) {
    operator_delete(local_48[0],local_38[0] + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

std::string toString() const
    {
        return joinStrings (pathSections, "::");
    }